

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatefootprint.cpp
# Opt level: O3

void __thiscall
ValidateFootprint::ReadFirstFootprintLine(ValidateFootprint *this,OASIS_FLOAT *totalProbability)

{
  Validate *this_00;
  int *__args;
  int *piVar1;
  iterator __position;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  size_t sVar5;
  
  this_00 = &this->super_Validate;
  pcVar4 = fgets(this_00->line_,0x1000,_stdin);
  if (pcVar4 != (char *)0x0) {
    __args = &(this->fr_).super_EventRow.intensity_bin_id;
    iVar2 = __isoc99_sscanf(this_00,"%lld,%llu,%d,%f",&this->initialEveID_,
                            &this->initialAreaperilID_,__args,
                            &(this->fr_).super_EventRow.probability);
    if (iVar2 == 4) {
      iVar2 = Validate::CheckIDDoesNotExceedMaxLimit(this_00,this->eveIDName_,this->initialEveID_);
      (this->fr_).event_id = iVar2;
      uVar3 = Validate::CheckIDDoesNotExceedMaxLimit
                        (this_00,this->areaperilIDName_,this->initialAreaperilID_);
      (this->fr_).super_EventRow.areaperil_id = uVar3;
      if (this->validationCheck_ == false) {
        (**this->_vptr_ValidateFootprint)(this);
        return;
      }
      piVar1 = &(this->super_Validate).lineno_;
      *piVar1 = *piVar1 + 1;
      this->prevEventID_ = (this->fr_).event_id;
      this->prevAreaPerilID_ = uVar3;
      sVar5 = strlen(this_00->line_);
      memcpy(this->prevLine_,this_00,sVar5 + 1);
      sVar5 = strlen(this_00->line_);
      this->prevLine_[sVar5 - 1] = '\0';
      __position._M_current =
           (this->intensityBinIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->intensityBinIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->intensityBinIDs_,__position,__args);
      }
      else {
        *__position._M_current = (this->fr_).super_EventRow.intensity_bin_id;
        (this->intensityBinIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      *totalProbability = (this->fr_).super_EventRow.probability;
      iVar2 = (this->fr_).super_EventRow.intensity_bin_id;
      if (iVar2 <= this->maxIntensityBin_) {
        return;
      }
      this->maxIntensityBin_ = iVar2;
      return;
    }
    ReadFirstFootprintLine();
  }
  ReadFirstFootprintLine((ValidateFootprint *)this_00);
  return;
}

Assistant:

void ValidateFootprint::ReadFirstFootprintLine(OASIS_FLOAT &totalProbability) {
/* After skipping header, first line of footprint csv file is read primarily to
 * establish initial event ID. */

  if (fgets(line_, sizeof(line_), stdin) != 0) {

    if (ScanLine() == 4) {

      fr_.event_id = CheckIDDoesNotExceedMaxLimit(eveIDName_, initialEveID_);
#ifdef AREAPERIL_TYPE_UNSIGNED_LONG_LONG
      // If areaperil ID is of data type unsigned long long, it is not possible
      // to check for overflow
      fr_.areaperil_id = initialAreaperilID_;
#else
      fr_.areaperil_id = CheckIDDoesNotExceedMaxLimit(areaperilIDName_,
						      initialAreaperilID_);
#endif

      // In the case when there are no validation checks to perform, the
      // initial previous event ID must still be set and line number
      // incremented. In this case, total probability is not used.
      if (!validationCheck_) {

        SetPreviousEventID();

	return;

      }

      StoreLine();
      intensityBinIDs_.push_back(fr_.intensity_bin_id);
      totalProbability = fr_.probability;

      SetMaximumIntensityBinIndex();

      return;

    }

    fprintf(stderr, "ERROR: Invalid data in line %d:\n%s\n", lineno_, line_);
    PrintErrorMessage();

  }

  fprintf(stderr, "ERROR: Empty file\n");
  PrintErrorMessage();

}